

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_avcc.cpp
# Opt level: O0

int read_avcc(avcc_t *avcc,h264_stream_t *h,bs_t *b)

{
  uint32_t uVar1;
  int iVar2;
  sps_t **ppsVar3;
  uint8_t *puVar4;
  pps_t **pppVar5;
  int rc_1;
  uint8_t *buf_1;
  int len_1;
  int pictureParameterSetLength;
  int i_1;
  int rc;
  uint8_t *buf;
  int len;
  int sequenceParameterSetLength;
  int i;
  bs_t *b_local;
  h264_stream_t *h_local;
  avcc_t *avcc_local;
  
  uVar1 = bs_read_u8(b);
  avcc->configurationVersion = uVar1;
  uVar1 = bs_read_u8(b);
  avcc->AVCProfileIndication = uVar1;
  uVar1 = bs_read_u8(b);
  avcc->profile_compatibility = uVar1;
  uVar1 = bs_read_u8(b);
  avcc->AVCLevelIndication = uVar1;
  bs_read_u(b,6);
  uVar1 = bs_read_u(b,2);
  avcc->lengthSizeMinusOne = uVar1;
  bs_read_u(b,3);
  uVar1 = bs_read_u(b,5);
  avcc->numOfSequenceParameterSets = uVar1;
  ppsVar3 = (sps_t **)calloc((long)avcc->numOfSequenceParameterSets,8);
  avcc->sps_table = ppsVar3;
  for (len = 0; len < avcc->numOfSequenceParameterSets; len = len + 1) {
    uVar1 = bs_read_u(b,0x10);
    puVar4 = (uint8_t *)malloc((long)(int)uVar1);
    iVar2 = bs_read_bytes(b,puVar4,uVar1);
    iVar2 = read_nal_unit(h,puVar4,iVar2);
    free(puVar4);
    if ((h->nal->nal_unit_type == 7) && (-1 < iVar2)) {
      avcc->sps_table[len] = h->sps;
    }
  }
  uVar1 = bs_read_u(b,8);
  avcc->numOfPictureParameterSets = uVar1;
  pppVar5 = (pps_t **)calloc((long)avcc->numOfSequenceParameterSets,8);
  avcc->pps_table = pppVar5;
  for (len_1 = 0; len_1 < avcc->numOfPictureParameterSets; len_1 = len_1 + 1) {
    uVar1 = bs_read_u(b,0x10);
    puVar4 = (uint8_t *)malloc((long)(int)uVar1);
    iVar2 = bs_read_bytes(b,puVar4,uVar1);
    iVar2 = read_nal_unit(h,puVar4,iVar2);
    free(puVar4);
    if ((h->nal->nal_unit_type == 8) && (-1 < iVar2)) {
      avcc->pps_table[len_1] = h->pps;
    }
  }
  iVar2 = bs_overrun(b);
  if (iVar2 == 0) {
    avcc_local._4_4_ = bs_pos(b);
  }
  else {
    avcc_local._4_4_ = -1;
  }
  return avcc_local._4_4_;
}

Assistant:

int read_avcc(avcc_t* avcc, h264_stream_t* h, bs_t* b)
{
    avcc->configurationVersion = bs_read_u8(b);
    avcc->AVCProfileIndication = bs_read_u8(b);
    avcc->profile_compatibility = bs_read_u8(b);
    avcc->AVCLevelIndication = bs_read_u8(b);
    /* int reserved = */ bs_read_u(b, 6); // '111111'b;
    avcc->lengthSizeMinusOne = bs_read_u(b, 2);
    /* int reserved = */ bs_read_u(b, 3); // '111'b;

    avcc->numOfSequenceParameterSets = bs_read_u(b, 5);
    avcc->sps_table = (sps_t**)calloc(avcc->numOfSequenceParameterSets, sizeof(sps_t*));
    for (int i = 0; i < avcc->numOfSequenceParameterSets; i++)
    {
        int sequenceParameterSetLength = bs_read_u(b, 16);
        int len = sequenceParameterSetLength;
        uint8_t* buf = (uint8_t*)malloc(len);
        len = bs_read_bytes(b, buf, len);
        int rc = read_nal_unit(h, buf, len);
        free(buf);
        if (h->nal->nal_unit_type != NAL_UNIT_TYPE_SPS) { continue; } // TODO report errors
        if (rc < 0) { continue; }
        avcc->sps_table[i] = h->sps; // TODO copy data?
    }

    avcc->numOfPictureParameterSets = bs_read_u(b, 8);
    avcc->pps_table = (pps_t**)calloc(avcc->numOfSequenceParameterSets, sizeof(pps_t*));
    for (int i = 0; i < avcc->numOfPictureParameterSets; i++)
    {
        int pictureParameterSetLength = bs_read_u(b, 16);
        int len = pictureParameterSetLength;
        uint8_t* buf = (uint8_t*)malloc(len);
        len = bs_read_bytes(b, buf, len);
        int rc = read_nal_unit(h, buf, len);
        free(buf);
        if (h->nal->nal_unit_type != NAL_UNIT_TYPE_PPS) { continue; } // TODO report errors
        if (rc < 0) { continue; }
        avcc->pps_table[i] = h->pps; // TODO copy data?
    }

    if (bs_overrun(b)) { return -1; }
    return bs_pos(b);
}